

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

void tcptran_pipe_recv_cancel(nni_aio *aio,void *arg,int rv)

{
  int iVar1;
  nni_aio *pnVar2;
  tcptran_pipe *p;
  int rv_local;
  void *arg_local;
  nni_aio *aio_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x600));
  iVar1 = nni_aio_list_active(aio);
  if (iVar1 == 0) {
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x600));
  }
  else {
    pnVar2 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x70));
    if (pnVar2 == aio) {
      nni_aio_abort((nni_aio *)((long)arg + 0x268),rv);
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x600));
    }
    else {
      nni_aio_list_remove(aio);
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x600));
      nni_aio_finish_error(aio,rv);
    }
  }
  return;
}

Assistant:

static void
tcptran_pipe_recv_cancel(nni_aio *aio, void *arg, int rv)
{
	tcptran_pipe *p = arg;

	nni_mtx_lock(&p->mtx);
	if (!nni_aio_list_active(aio)) {
		nni_mtx_unlock(&p->mtx);
		return;
	}
	// If receive in progress, then cancel the pending transfer.
	// The callback on the rxaio will cause the user aio to
	// be canceled too.
	if (nni_list_first(&p->recvq) == aio) {
		nni_aio_abort(&p->rxaio, rv);
		nni_mtx_unlock(&p->mtx);
		return;
	}
	nni_aio_list_remove(aio);
	nni_mtx_unlock(&p->mtx);
	nni_aio_finish_error(aio, rv);
}